

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O2

int __thiscall diy::FileStorage::open_random(FileStorage *this,string *filename)

{
  int iVar1;
  
  if ((long)(this->filename_templates_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->filename_templates_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    rand();
  }
  std::__cxx11::string::assign((char *)filename);
  iVar1 = io::utils::mkstemp((char *)filename);
  return iVar1;
}

Assistant:

int           open_random(std::string& filename) const
      {
        if (filename_templates_.size() == 1)
            filename = filename_templates_[0].c_str();
        else
        {
            // pick a template at random (very basic load balancing mechanism)
            filename  = filename_templates_[static_cast<size_t>(std::rand()) % filename_templates_.size()].c_str();
        }
        int fh = diy::io::utils::mkstemp(filename);
        return fh;
      }